

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O0

bool __thiscall CUI::OnInput(CUI *this,CEvent *e)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  CLineInput *pCVar4;
  IInput *pIVar5;
  uint *in_RSI;
  CUI *in_RDI;
  CLineInput *unaff_retaddr;
  uint LastHotkeysPressed;
  CLineInput *pActiveInput;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  bVar2 = Enabled(in_RDI);
  if (!bVar2) {
    return false;
  }
  pCVar4 = CLineInput::GetActiveInput();
  if ((pCVar4 != (CLineInput *)0x0) &&
     (bVar2 = CLineInput::ProcessInput
                        (unaff_retaddr,
                         (CEvent *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8)),
     bVar2)) {
    return true;
  }
  if ((*in_RSI & 1) == 0) {
    return false;
  }
  uVar1 = in_RDI->m_HotkeysPressed;
  if ((in_RSI[1] == 0xd) || (in_RSI[1] == 0xd8)) {
    in_RDI->m_HotkeysPressed = in_RDI->m_HotkeysPressed | 1;
  }
  else if (in_RSI[1] == 0x1b) {
    in_RDI->m_HotkeysPressed = in_RDI->m_HotkeysPressed | 2;
  }
  else {
    if (in_RSI[1] == 9) {
      pIVar5 = Input(in_RDI);
      uVar3 = (*(pIVar5->super_IInterface)._vptr_IInterface[4])(pIVar5,0x162);
      if ((uVar3 & 1) == 0) {
        pIVar5 = Input(in_RDI);
        uVar3 = (*(pIVar5->super_IInterface)._vptr_IInterface[4])(pIVar5,0x166);
        if ((uVar3 & 1) == 0) {
          in_RDI->m_HotkeysPressed = in_RDI->m_HotkeysPressed | 0x20;
          goto LAB_001dbe4b;
        }
      }
    }
    if (in_RSI[1] == 0x7f) {
      in_RDI->m_HotkeysPressed = in_RDI->m_HotkeysPressed | 0x10;
    }
    else if (in_RSI[1] == 0xd2) {
      in_RDI->m_HotkeysPressed = in_RDI->m_HotkeysPressed | 4;
    }
    else if (in_RSI[1] == 0xd1) {
      in_RDI->m_HotkeysPressed = in_RDI->m_HotkeysPressed | 8;
    }
  }
LAB_001dbe4b:
  return uVar1 != in_RDI->m_HotkeysPressed;
}

Assistant:

bool CUI::OnInput(const IInput::CEvent &e)
{
	if(!Enabled())
		return false;

	CLineInput *pActiveInput = CLineInput::GetActiveInput();
	if(pActiveInput && pActiveInput->ProcessInput(e))
		return true;

	if(e.m_Flags&IInput::FLAG_PRESS)
	{
		unsigned LastHotkeysPressed = m_HotkeysPressed;
		if(e.m_Key == KEY_RETURN || e.m_Key == KEY_KP_ENTER)
			m_HotkeysPressed |= HOTKEY_ENTER;
		else if(e.m_Key == KEY_ESCAPE)
			m_HotkeysPressed |= HOTKEY_ESCAPE;
		else if(e.m_Key == KEY_TAB && !Input()->KeyIsPressed(KEY_LALT) && !Input()->KeyIsPressed(KEY_RALT))
			m_HotkeysPressed |= HOTKEY_TAB;
		else if(e.m_Key == KEY_DELETE)
			m_HotkeysPressed |= HOTKEY_DELETE;
		else if(e.m_Key == KEY_UP)
			m_HotkeysPressed |= HOTKEY_UP;
		else if(e.m_Key == KEY_DOWN)
			m_HotkeysPressed |= HOTKEY_DOWN;
		return LastHotkeysPressed != m_HotkeysPressed;
	}
	return false;
}